

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

void __thiscall
DListBase<Memory::ArenaAllocator,_RealCount>::RemoveElement<Memory::HeapAllocator>
          (DListBase<Memory::ArenaAllocator,_RealCount> *this,HeapAllocator *allocator,
          ArenaAllocator *element)

{
  code *pcVar1;
  bool bVar2;
  size_t *obj;
  undefined8 *in_FS_OFFSET;
  Node *node;
  ArenaAllocator *element_local;
  HeapAllocator *allocator_local;
  DListBase<Memory::ArenaAllocator,_RealCount> *this_local;
  
  obj = &element[-1].super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
         freeListSize;
  bVar2 = HasNode(this,(NodeBase *)obj);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x175,"(HasNode(node))","HasNode(node)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  RemoveNode((NodeBase *)obj);
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,DListNode<Memory::ArenaAllocator>>
            (allocator,(DListNode<Memory::ArenaAllocator> *)obj);
  RealCount::DecrementCount(&this->super_RealCount);
  return;
}

Assistant:

void RemoveElement(TAllocator * allocator, TData * element)
    {
        Node * node = CONTAINING_RECORD(element, Node, data);
#if DBG_DUMP
        Assert(HasNode(node));
#endif
        DListBase::RemoveNode(node);
        AllocatorDelete(TAllocator, allocator, node);

        this->DecrementCount();

    }